

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

int Lpk_NodeCutsCheckDsd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  bool bVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_3c;
  int RetValue;
  int fLeavesOnly;
  int nCands;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Lpk_Cut_t *pCut_local;
  Lpk_Man_t *p_local;
  
  if (((undefined1  [212])*pCut & (undefined1  [212])0x3f) == (undefined1  [212])0x0) {
    __assert_fail("pCut->nLeaves > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                  ,0x117,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
  }
  memset(p->pRefs,0,(ulong)(*(uint *)pCut & 0x3f) << 2);
  for (nCands = 0; nCands < (int)(*(uint *)pCut & 0x3f); nCands = nCands + 1) {
    pAVar3 = Abc_NtkObj(p->pNtk,pCut->pLeaves[nCands]);
    if ((*(uint *)&pAVar3->field_0x14 >> 4 & 1) != 0) {
      __assert_fail("pObj->fMarkA == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                    ,0x11d,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
    }
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | 0x10;
    pAVar3->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)nCands;
  }
  RetValue = 0;
  for (nCands = 0; nCands < (int)(*(uint *)pCut >> 6 & 0x3f); nCands = nCands + 1) {
    pAVar3 = Abc_NtkObj(p->pNtk,pCut->pNodes[nCands]);
    bVar1 = true;
    for (fLeavesOnly = 0; iVar2 = Abc_ObjFaninNum(pAVar3), fLeavesOnly < iVar2;
        fLeavesOnly = fLeavesOnly + 1) {
      pAVar4 = Abc_ObjFanin(pAVar3,fLeavesOnly);
      if ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) == 0) {
        bVar1 = false;
      }
      else {
        iVar2 = (pAVar4->field_6).iTemp;
        p->pRefs[iVar2] = p->pRefs[iVar2] + 1;
      }
    }
    if (bVar1) {
      p->pCands[RetValue] = pAVar3->Id;
      RetValue = RetValue + 1;
    }
  }
  local_3c = 0;
  nCands = 0;
  do {
    if (RetValue <= nCands) {
LAB_005a2aaf:
      for (nCands = 0; nCands < (int)(*(uint *)pCut & 0x3f); nCands = nCands + 1) {
        pAVar3 = Abc_NtkObj(p->pNtk,pCut->pLeaves[nCands]);
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef;
      }
      return local_3c;
    }
    pAVar3 = Abc_NtkObj(p->pNtk,p->pCands[nCands]);
    for (fLeavesOnly = 0; iVar2 = Abc_ObjFaninNum(pAVar3), fLeavesOnly < iVar2;
        fLeavesOnly = fLeavesOnly + 1) {
      pAVar4 = Abc_ObjFanin(pAVar3,fLeavesOnly);
      if ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) != 1) {
        __assert_fail("pFanin->fMarkA == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x135,"int Lpk_NodeCutsCheckDsd(Lpk_Man_t *, Lpk_Cut_t *)");
      }
      if (1 < p->pRefs[(pAVar4->field_6).iTemp]) break;
    }
    iVar2 = Abc_ObjFaninNum(pAVar3);
    if (fLeavesOnly == iVar2) {
      local_3c = 1;
      goto LAB_005a2aaf;
    }
    nCands = nCands + 1;
  } while( true );
}

Assistant:

int Lpk_NodeCutsCheckDsd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nCands, fLeavesOnly, RetValue;
    assert( pCut->nLeaves > 0 );
    // clear ref counters
    memset( p->pRefs, 0, sizeof(int) * pCut->nLeaves );
    // mark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
    {
        assert( pObj->fMarkA == 0 );
        pObj->fMarkA = 1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;
    }
    // ref leaves pointed from the internal nodes
    nCands = 0;
    Lpk_CutForEachNode( p->pNtk, pCut, pObj, i )
    {
        fLeavesOnly = 1;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->fMarkA )
                p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy]++;
            else
                fLeavesOnly = 0;
        if ( fLeavesOnly )
            p->pCands[nCands++] = pObj->Id;
    }
    // look at the nodes that only point to the leaves
    RetValue = 0;
    for ( i = 0; i < nCands; i++ )
    {
        pObj = Abc_NtkObj( p->pNtk, p->pCands[i] );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( pFanin->fMarkA == 1 );
            if ( p->pRefs[(int)(ABC_PTRUINT_T)pFanin->pCopy] > 1 )
                break;
        }
        if ( k == Abc_ObjFaninNum(pObj) )
        {
            RetValue = 1;
            break;
        }
    }
    // unmark cut leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->fMarkA = 0;
    return RetValue;
}